

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O1

back_insert_iterator<fmt::v8::detail::buffer<char16_t>_>
fmt::v8::detail::
write_int_noinline<char16_t,std::back_insert_iterator<fmt::v8::detail::buffer<char16_t>>,unsigned_int>
          (back_insert_iterator<fmt::v8::detail::buffer<char16_t>_> out,
          write_int_arg<unsigned_int> arg,basic_format_specs<char16_t> *specs,locale_ref loc)

{
  presentation_type pVar1;
  size_t sVar2;
  bool bVar3;
  uint uVar4;
  char *digits_1;
  back_insert_iterator<fmt::v8::detail::buffer<char16_t>_> bVar5;
  char16_t *pcVar6;
  byte *pbVar7;
  char *pcVar8;
  write_int_arg<unsigned_int> wVar9;
  char *pcVar10;
  char *pcVar11;
  int size;
  ulong uVar12;
  uint uVar13;
  uint uVar14;
  ulong uVar15;
  uint uVar16;
  ulong uVar17;
  format_decimal_result<char16_t_*> fVar18;
  char16_t buffer [10];
  write_int_data<char16_t> data;
  back_insert_iterator<fmt::v8::detail::buffer<char16_t>_> local_70;
  undefined1 local_68 [32];
  bool local_48;
  write_int_data<char16_t> local_40;
  
  pVar1 = specs->type;
  local_70.container = out.container;
  if (pVar1 < string) {
    uVar17 = (ulong)arg >> 0x20;
    uVar16 = arg.prefix;
    uVar14 = arg.abs_value;
    switch(pVar1) {
    case none:
    case dec:
      if (((specs->field_0xa & 1) != 0) &&
         (bVar3 = write_int_localized<std::back_insert_iterator<fmt::v8::detail::buffer<char16_t>>,unsigned_long,char16_t>
                            (&local_70,(ulong)arg & 0xffffffff,uVar16,specs,loc), bVar3)) {
        return (back_insert_iterator<fmt::v8::detail::buffer<char16_t>_>)local_70.container;
      }
      bVar5.container = local_70.container;
      uVar13 = 0x1f;
      if ((uVar14 | 1) != 0) {
        for (; (uVar14 | 1) >> uVar13 == 0; uVar13 = uVar13 - 1) {
        }
      }
      uVar15 = ((ulong)arg & 0xffffffff) +
               *(long *)(do_count_digits(unsigned_int)::table + (ulong)uVar13 * 8);
      size = (int)(uVar15 >> 0x20);
      if (specs->precision != -1 || specs->width != 0) {
        write_int_data<char16_t>::write_int_data(&local_40,size,uVar16,specs);
        local_68._8_8_ = local_40.size;
        local_68._16_8_ = local_40.padding;
        local_68._24_8_ = (ulong)arg & 0xffffffff | uVar15 & 0xffffffff00000000;
        local_68._0_4_ = uVar16;
        bVar5 = write_padded<(fmt::v8::align::type)2,std::back_insert_iterator<fmt::v8::detail::buffer<char16_t>>,char16_t,fmt::v8::detail::write_int<std::back_insert_iterator<fmt::v8::detail::buffer<char16_t>>,char16_t,fmt::v8::detail::write_int<char16_t,std::back_insert_iterator<fmt::v8::detail::buffer<char16_t>>,unsigned_int>(std::back_insert_iterator<fmt::v8::detail::buffer<char16_t>>,fmt::v8::detail::write_int_arg<unsigned_int>,fmt::v8::basic_format_specs<char16_t>const&,fmt::v8::detail::locale_ref)::_lambda(std::back_insert_iterator<fmt::v8::detail::buffer<char16_t>>)_1_>(std::back_insert_iterator<fmt::v8::detail::buffer<char16_t>>,int,unsigned_int,fmt::v8::basic_format_specs<char16_t>const&,fmt::v8::detail::write_int<char16_t,std::back_insert_iterator<fmt::v8::detail::buffer<char16_t>>,unsigned_int>(std::back_insert_iterator<fmt::v8::detail::buffer<char16_t>>,fmt::v8::detail::write_int_arg<unsigned_int>,fmt::v8::basic_format_specs<char16_t>const&,fmt::v8::detail::locale_ref)::_lambda(std::back_insert_iterator<fmt::v8::detail::buffer<char16_t>>)_1_)::_lambda(std::back_insert_iterator<fmt::v8::detail::buffer<char16_t>>)_1_&>
                          (bVar5,specs,local_40.size,local_40.size,
                           (anon_class_32_3_03e05ccd *)local_68);
        return (back_insert_iterator<fmt::v8::detail::buffer<char16_t>_>)bVar5.container;
      }
      if (-1 < (long)uVar15) {
        if ((uVar17 != 0) && (uVar16 = uVar16 & 0xffffff, ((ulong)arg & 0xffffff00000000) != 0)) {
          do {
            if ((bVar5.container)->capacity_ < (bVar5.container)->size_ + 1) {
              (**(bVar5.container)->_vptr_buffer)(bVar5.container);
            }
            sVar2 = (bVar5.container)->size_;
            (bVar5.container)->size_ = sVar2 + 1;
            (bVar5.container)->ptr_[sVar2] = (ushort)uVar16 & 0xff;
            bVar3 = 0xff < uVar16;
            uVar16 = uVar16 >> 8;
          } while (bVar3);
        }
        fVar18 = format_decimal<char16_t,unsigned_int>((char16_t *)local_68,uVar14,size);
        bVar5 = copy_str_noinline<char16_t,char16_t*,std::back_insert_iterator<fmt::v8::detail::buffer<char16_t>>>
                          ((char16_t *)local_68,fVar18.end,bVar5);
        return (back_insert_iterator<fmt::v8::detail::buffer<char16_t>_>)bVar5.container;
      }
      fmt::v8::detail::assert_fail
                ("/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/external/fmt/include/fmt/core.h"
                 ,0x195,"negative value");
    case oct:
      uVar13 = 0x1f;
      if ((uVar14 | 1) != 0) {
        for (; (uVar14 | 1) >> uVar13 == 0; uVar13 = uVar13 - 1) {
        }
      }
      uVar15 = (ulong)uVar13;
      uVar13 = (int)(uVar15 * 0x55555556 >> 0x20) + 1;
      if (((specs->field_0x9 & 0x80) != 0) && (uVar14 != 0 && specs->precision <= (int)uVar13)) {
        uVar14 = 0x3000;
        if (uVar17 == 0) {
          uVar14 = 0x30;
        }
        uVar17 = (ulong)((uVar14 | uVar16) + 0x1000000);
      }
      uVar12 = (ulong)uVar13;
      uVar14 = (uint)uVar17;
      if (specs->precision != -1 || specs->width != 0) {
        write_int_data<char16_t>::write_int_data(&local_40,uVar13,uVar14,specs);
        local_68._8_8_ = local_40.size;
        local_68._16_8_ = local_40.padding;
        local_68._24_8_ = (ulong)arg & 0xffffffff | uVar12 << 0x20;
        local_68._0_4_ = uVar14;
        bVar5 = write_padded<(fmt::v8::align::type)2,std::back_insert_iterator<fmt::v8::detail::buffer<char16_t>>,char16_t,fmt::v8::detail::write_int<std::back_insert_iterator<fmt::v8::detail::buffer<char16_t>>,char16_t,fmt::v8::detail::write_int<char16_t,std::back_insert_iterator<fmt::v8::detail::buffer<char16_t>>,unsigned_int>(std::back_insert_iterator<fmt::v8::detail::buffer<char16_t>>,fmt::v8::detail::write_int_arg<unsigned_int>,fmt::v8::basic_format_specs<char16_t>const&,fmt::v8::detail::locale_ref)::_lambda(std::back_insert_iterator<fmt::v8::detail::buffer<char16_t>>)_4_>(std::back_insert_iterator<fmt::v8::detail::buffer<char16_t>>,int,unsigned_int,fmt::v8::basic_format_specs<char16_t>const&,fmt::v8::detail::write_int<char16_t,std::back_insert_iterator<fmt::v8::detail::buffer<char16_t>>,unsigned_int>(std::back_insert_iterator<fmt::v8::detail::buffer<char16_t>>,fmt::v8::detail::write_int_arg<unsigned_int>,fmt::v8::basic_format_specs<char16_t>const&,fmt::v8::detail::locale_ref)::_lambda(std::back_insert_iterator<fmt::v8::detail::buffer<char16_t>>)_4_)::_lambda(std::back_insert_iterator<fmt::v8::detail::buffer<char16_t>>)_1_&>
                          (out,specs,local_40.size,local_40.size,
                           (anon_class_32_3_03e05ccd *)local_68);
        return (back_insert_iterator<fmt::v8::detail::buffer<char16_t>_>)bVar5.container;
      }
      if ((uVar14 != 0) && (uVar14 = uVar14 & 0xffffff, (uVar17 & 0xffffff) != 0)) {
        do {
          if ((out.container)->capacity_ < (out.container)->size_ + 1) {
            (**(out.container)->_vptr_buffer)(out.container);
          }
          sVar2 = (out.container)->size_;
          (out.container)->size_ = sVar2 + 1;
          (out.container)->ptr_[sVar2] = (ushort)uVar14 & 0xff;
          bVar3 = 0xff < uVar14;
          uVar14 = uVar14 >> 8;
        } while (bVar3);
      }
      sVar2 = (out.container)->size_;
      uVar17 = sVar2 + uVar12;
      if ((out.container)->capacity_ < uVar17) {
        pcVar6 = (char16_t *)0x0;
      }
      else {
        (out.container)->size_ = uVar17;
        pcVar6 = (out.container)->ptr_ + sVar2;
      }
      if (pcVar6 != (char16_t *)0x0) {
        pcVar6 = pcVar6 + uVar15 / 3;
        wVar9 = (write_int_arg<unsigned_int>)((ulong)arg & 0xffffffff);
        do {
          uVar14 = arg.abs_value;
          *pcVar6 = (ushort)arg.abs_value & 7 | 0x30;
          wVar9 = (write_int_arg<unsigned_int>)((ulong)wVar9 >> 3);
          pcVar6 = pcVar6 + -1;
          arg = wVar9;
        } while (7 < uVar14);
        return (back_insert_iterator<fmt::v8::detail::buffer<char16_t>_>)out.container;
      }
      pcVar10 = local_68 + uVar12;
      pbVar7 = local_68 + uVar15 / 3;
      wVar9 = (write_int_arg<unsigned_int>)((ulong)arg & 0xffffffff);
      do {
        uVar14 = arg.abs_value;
        *pbVar7 = (byte)arg.abs_value & 7 | 0x30;
        wVar9 = (write_int_arg<unsigned_int>)((ulong)wVar9 >> 3);
        pbVar7 = pbVar7 + -1;
        arg = wVar9;
      } while (7 < uVar14);
      break;
    case hex_lower:
    case hex_upper:
      if ((specs->field_0x9 & 0x80) != 0) {
        uVar4 = (uint)(pVar1 != hex_upper) << 0xd | 0x5830;
        uVar13 = uVar4 << 8;
        if (uVar17 == 0) {
          uVar13 = uVar4;
        }
        uVar17 = (ulong)((uVar13 | uVar16) + 0x2000000);
      }
      uVar16 = 0x1f;
      if ((uVar14 | 1) != 0) {
        for (; (uVar14 | 1) >> uVar16 == 0; uVar16 = uVar16 - 1) {
        }
      }
      uVar14 = 8 - ((uVar16 ^ 0x1c) >> 2);
      uVar15 = (ulong)uVar14;
      uVar16 = (uint)uVar17;
      if (specs->precision != -1 || specs->width != 0) {
        write_int_data<char16_t>::write_int_data(&local_40,uVar14,uVar16,specs);
        local_68._8_8_ = local_40.size;
        local_68._16_8_ = local_40.padding;
        local_68._24_8_ = (ulong)arg & 0xffffffff | uVar15 << 0x20;
        local_68._0_4_ = uVar16;
        local_48 = pVar1 == hex_upper;
        bVar5 = write_padded<(fmt::v8::align::type)2,std::back_insert_iterator<fmt::v8::detail::buffer<char16_t>>,char16_t,fmt::v8::detail::write_int<std::back_insert_iterator<fmt::v8::detail::buffer<char16_t>>,char16_t,fmt::v8::detail::write_int<char16_t,std::back_insert_iterator<fmt::v8::detail::buffer<char16_t>>,unsigned_int>(std::back_insert_iterator<fmt::v8::detail::buffer<char16_t>>,fmt::v8::detail::write_int_arg<unsigned_int>,fmt::v8::basic_format_specs<char16_t>const&,fmt::v8::detail::locale_ref)::_lambda(std::back_insert_iterator<fmt::v8::detail::buffer<char16_t>>)_2_>(std::back_insert_iterator<fmt::v8::detail::buffer<char16_t>>,int,unsigned_int,fmt::v8::basic_format_specs<char16_t>const&,fmt::v8::detail::write_int<char16_t,std::back_insert_iterator<fmt::v8::detail::buffer<char16_t>>,unsigned_int>(std::back_insert_iterator<fmt::v8::detail::buffer<char16_t>>,fmt::v8::detail::write_int_arg<unsigned_int>,fmt::v8::basic_format_specs<char16_t>const&,fmt::v8::detail::locale_ref)::_lambda(std::back_insert_iterator<fmt::v8::detail::buffer<char16_t>>)_2_)::_lambda(std::back_insert_iterator<fmt::v8::detail::buffer<char16_t>>)_1_&>
                          (out,specs,local_40.size,local_40.size,
                           (anon_class_40_3_03e05ccd *)local_68);
        return (back_insert_iterator<fmt::v8::detail::buffer<char16_t>_>)bVar5.container;
      }
      if ((uVar16 != 0) && (uVar14 = uVar16 & 0xffffff, (uVar17 & 0xffffff) != 0)) {
        do {
          if ((out.container)->capacity_ < (out.container)->size_ + 1) {
            (**(out.container)->_vptr_buffer)(out.container);
          }
          sVar2 = (out.container)->size_;
          (out.container)->size_ = sVar2 + 1;
          (out.container)->ptr_[sVar2] = (ushort)uVar14 & 0xff;
          bVar3 = 0xff < uVar14;
          uVar14 = uVar14 >> 8;
        } while (bVar3);
      }
      sVar2 = (out.container)->size_;
      uVar17 = sVar2 + uVar15;
      if ((out.container)->capacity_ < uVar17) {
        pcVar6 = (char16_t *)0x0;
      }
      else {
        (out.container)->size_ = uVar17;
        pcVar6 = (out.container)->ptr_ + sVar2;
      }
      if (pcVar6 != (char16_t *)0x0) {
        pcVar10 = "0123456789abcdef";
        if (pVar1 == hex_upper) {
          pcVar10 = "0123456789ABCDEF";
        }
        pcVar6 = pcVar6 + uVar15;
        wVar9 = (write_int_arg<unsigned_int>)((ulong)arg & 0xffffffff);
        do {
          pcVar6 = pcVar6 + -1;
          uVar14 = arg.abs_value;
          *pcVar6 = (short)pcVar10[uVar14 & 0xf];
          wVar9 = (write_int_arg<unsigned_int>)((ulong)wVar9 >> 4);
          arg = wVar9;
        } while (0xf < uVar14);
        return (back_insert_iterator<fmt::v8::detail::buffer<char16_t>_>)out.container;
      }
      pcVar10 = local_68 + uVar15;
      pcVar8 = "0123456789abcdef";
      if (pVar1 == hex_upper) {
        pcVar8 = "0123456789ABCDEF";
      }
      pcVar11 = local_68 + (uVar15 - 1);
      wVar9 = (write_int_arg<unsigned_int>)((ulong)arg & 0xffffffff);
      do {
        uVar14 = arg.abs_value;
        *pcVar11 = pcVar8[uVar14 & 0xf];
        wVar9 = (write_int_arg<unsigned_int>)((ulong)wVar9 >> 4);
        pcVar11 = pcVar11 + -1;
        arg = wVar9;
      } while (0xf < uVar14);
      break;
    case bin_lower:
    case bin_upper:
      if ((specs->field_0x9 & 0x80) != 0) {
        uVar4 = (uint)(pVar1 != bin_upper) << 0xd | 0x4230;
        uVar13 = uVar4 << 8;
        if (uVar17 == 0) {
          uVar13 = uVar4;
        }
        uVar17 = (ulong)((uVar13 | uVar16) + 0x2000000);
      }
      uVar16 = 0x1f;
      if ((uVar14 | 1) != 0) {
        for (; (uVar14 | 1) >> uVar16 == 0; uVar16 = uVar16 - 1) {
        }
      }
      uVar14 = (uVar16 ^ 0xffffffe0) + 0x21;
      uVar15 = (ulong)uVar14;
      uVar16 = (uint)uVar17;
      if (specs->precision != -1 || specs->width != 0) {
        write_int_data<char16_t>::write_int_data(&local_40,uVar14,uVar16,specs);
        local_68._8_8_ = local_40.size;
        local_68._16_8_ = local_40.padding;
        local_68._24_8_ = (ulong)arg & 0xffffffff | uVar15 << 0x20;
        local_68._0_4_ = uVar16;
        bVar5 = write_padded<(fmt::v8::align::type)2,std::back_insert_iterator<fmt::v8::detail::buffer<char16_t>>,char16_t,fmt::v8::detail::write_int<std::back_insert_iterator<fmt::v8::detail::buffer<char16_t>>,char16_t,fmt::v8::detail::write_int<char16_t,std::back_insert_iterator<fmt::v8::detail::buffer<char16_t>>,unsigned_int>(std::back_insert_iterator<fmt::v8::detail::buffer<char16_t>>,fmt::v8::detail::write_int_arg<unsigned_int>,fmt::v8::basic_format_specs<char16_t>const&,fmt::v8::detail::locale_ref)::_lambda(std::back_insert_iterator<fmt::v8::detail::buffer<char16_t>>)_3_>(std::back_insert_iterator<fmt::v8::detail::buffer<char16_t>>,int,unsigned_int,fmt::v8::basic_format_specs<char16_t>const&,fmt::v8::detail::write_int<char16_t,std::back_insert_iterator<fmt::v8::detail::buffer<char16_t>>,unsigned_int>(std::back_insert_iterator<fmt::v8::detail::buffer<char16_t>>,fmt::v8::detail::write_int_arg<unsigned_int>,fmt::v8::basic_format_specs<char16_t>const&,fmt::v8::detail::locale_ref)::_lambda(std::back_insert_iterator<fmt::v8::detail::buffer<char16_t>>)_3_)::_lambda(std::back_insert_iterator<fmt::v8::detail::buffer<char16_t>>)_1_&>
                          (out,specs,local_40.size,local_40.size,
                           (anon_class_32_3_03e05ccd *)local_68);
        return (back_insert_iterator<fmt::v8::detail::buffer<char16_t>_>)bVar5.container;
      }
      if ((uVar16 != 0) && (uVar14 = uVar16 & 0xffffff, (uVar17 & 0xffffff) != 0)) {
        do {
          if ((out.container)->capacity_ < (out.container)->size_ + 1) {
            (**(out.container)->_vptr_buffer)(out.container);
          }
          sVar2 = (out.container)->size_;
          (out.container)->size_ = sVar2 + 1;
          (out.container)->ptr_[sVar2] = (ushort)uVar14 & 0xff;
          bVar3 = 0xff < uVar14;
          uVar14 = uVar14 >> 8;
        } while (bVar3);
      }
      sVar2 = (out.container)->size_;
      uVar17 = sVar2 + uVar15;
      if ((out.container)->capacity_ < uVar17) {
        pcVar6 = (char16_t *)0x0;
      }
      else {
        (out.container)->size_ = uVar17;
        pcVar6 = (out.container)->ptr_ + sVar2;
      }
      if (pcVar6 != (char16_t *)0x0) {
        pcVar6 = pcVar6 + uVar15;
        wVar9 = (write_int_arg<unsigned_int>)((ulong)arg & 0xffffffff);
        do {
          pcVar6 = pcVar6 + -1;
          uVar14 = arg.abs_value;
          *pcVar6 = (ushort)arg.abs_value & 1 | 0x30;
          wVar9 = (write_int_arg<unsigned_int>)((ulong)wVar9 >> 1);
          arg = wVar9;
        } while (1 < uVar14);
        return (back_insert_iterator<fmt::v8::detail::buffer<char16_t>_>)out.container;
      }
      pcVar10 = local_68 + uVar15;
      pbVar7 = local_68 + (uVar15 - 1);
      wVar9 = (write_int_arg<unsigned_int>)((ulong)arg & 0xffffffff);
      do {
        uVar14 = arg.abs_value;
        *pbVar7 = (byte)arg.abs_value & 1 | 0x30;
        wVar9 = (write_int_arg<unsigned_int>)((ulong)wVar9 >> 1);
        pbVar7 = pbVar7 + -1;
        arg = wVar9;
      } while (1 < uVar14);
      break;
    default:
      goto switchD_0015fa70_caseD_7;
    case chr:
      local_68._0_2_ = (short)arg.abs_value;
      bVar5 = write_padded<(fmt::v8::align::type)1,std::back_insert_iterator<fmt::v8::detail::buffer<char16_t>>,char16_t,fmt::v8::detail::write_char<char16_t,std::back_insert_iterator<fmt::v8::detail::buffer<char16_t>>>(std::back_insert_iterator<fmt::v8::detail::buffer<char16_t>>,char16_t,fmt::v8::basic_format_specs<char16_t>const&)::_lambda(std::back_insert_iterator<fmt::v8::detail::buffer<char16_t>>)_1_&>
                        (out,specs,1,1,(anon_class_2_1_a8c68091 *)local_68);
      return (back_insert_iterator<fmt::v8::detail::buffer<char16_t>_>)bVar5.container;
    }
    bVar5 = copy_str_noinline<char16_t,char*,std::back_insert_iterator<fmt::v8::detail::buffer<char16_t>>>
                      (local_68,pcVar10,out);
    return (back_insert_iterator<fmt::v8::detail::buffer<char16_t>_>)bVar5.container;
  }
switchD_0015fa70_caseD_7:
  fmt::v8::detail::throw_format_error("invalid type specifier");
}

Assistant:

FMT_CONSTEXPR FMT_NOINLINE auto write_int_noinline(
    OutputIt out, write_int_arg<T> arg, const basic_format_specs<Char>& specs,
    locale_ref loc) -> OutputIt {
  return write_int(out, arg, specs, loc);
}